

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEvR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  char cVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  RepeatedField<int> *this;
  uint *puVar6;
  ulong uVar7;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar8;
  ulong uVar9;
  ushort *puVar10;
  int value;
  char *pcVar11;
  
  if (data.field_0._0_2_ != 0) {
    pcVar11 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar11;
  }
  this = RefAt<google::protobuf::RepeatedField<int>>(msg,(ulong)data.field_0 >> 0x30);
  uVar2 = *(ushort *)ptr;
  puVar6 = *(uint **)((long)&table->has_bits_offset +
                     ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  do {
    pcVar11 = (char *)(long)(char)*(ushort *)((long)ptr + 2);
    if ((long)pcVar11 < 0) {
      uVar9 = (long)*(char *)((long)ptr + 3) << 7 | 0x7f;
      if ((long)uVar9 < 0) {
        aVar8.data = (long)(char)*(ushort *)((long)ptr + 4) << 0xe | 0x3fff;
        if ((long)aVar8 < 0) {
          uVar9 = uVar9 & ((long)*(char *)((long)ptr + 5) << 0x15 | 0x1fffffU);
          if ((long)uVar9 < 0) {
            aVar8.data = aVar8.data & ((long)(char)*(ushort *)((long)ptr + 6) << 0x1c | 0xfffffffU);
            if ((long)aVar8.data < 0) {
              uVar9 = uVar9 & ((long)*(char *)((long)ptr + 7) << 0x23 | 0x7ffffffffU);
              if ((long)uVar9 < 0) {
                aVar8.data = aVar8.data &
                             ((long)(char)*(ushort *)((long)ptr + 8) << 0x2a | 0x3ffffffffffU);
                if ((long)aVar8 < 0) {
                  uVar9 = uVar9 & ((long)*(char *)((long)ptr + 9) << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar9 < 0) {
                    uVar7 = (ulong)(byte)*(ushort *)((long)ptr + 10) << 0x38 | 0xffffffffffffff;
                    aVar8.data = aVar8.data & uVar7;
                    if ((long)aVar8 < 0) {
                      puVar10 = (ushort *)((long)ptr + 0xc);
                      cVar1 = *(char *)((long)ptr + 0xb);
                      if ((cVar1 != '\x01') && (cVar1 < '\0')) {
                        pcVar11 = Error(msg,pcVar11,
                                        (ParseContext *)CONCAT71((int7)(uVar7 >> 8),cVar1),
                                        (TcFieldData)aVar8,table,hasbits);
                        return pcVar11;
                      }
                    }
                    else {
                      puVar10 = (ushort *)((long)ptr + 0xb);
                    }
                  }
                  else {
                    puVar10 = (ushort *)((long)ptr + 10);
                  }
                }
                else {
                  puVar10 = (ushort *)((long)ptr + 9);
                }
              }
              else {
                puVar10 = (ushort *)((long)ptr + 8);
              }
            }
            else {
              puVar10 = (ushort *)((long)ptr + 7);
            }
          }
          else {
            puVar10 = (ushort *)((long)ptr + 6);
          }
        }
        else {
          puVar10 = (ushort *)((long)ptr + 5);
        }
        uVar9 = uVar9 & aVar8.data;
      }
      else {
        puVar10 = (ushort *)((long)ptr + 4);
      }
      pcVar11 = (char *)((ulong)pcVar11 & uVar9);
    }
    else {
      puVar10 = (ushort *)((long)ptr + 3);
    }
    uVar9 = (ulong)(*puVar6 >> 0x10);
    value = (int)pcVar11;
    uVar7 = (long)value - (long)(short)*puVar6;
    aVar8.data = uVar7 - uVar9;
    if (uVar9 <= uVar7) {
      uVar5 = puVar6[1];
      if ((ulong)aVar8 < (ulong)(uVar5 & 0xffff)) {
        if ((puVar6[(aVar8.data >> 5) + 2] >> ((uint)aVar8.data & 0x1f) & 1) == 0) {
LAB_001e2c5c:
          pcVar11 = FastUnknownEnumFallback(msg,ptr,ctx,(TcFieldData)aVar8,table,hasbits);
          return pcVar11;
        }
      }
      else {
        aVar8._0_4_ = uVar5 >> 0x10;
        aVar8.data._4_4_ = 0;
        uVar9 = 0;
        do {
          if (aVar8.data <= uVar9) goto LAB_001e2c5c;
          iVar4 = *(int *)((long)puVar6 + uVar9 * 4 + (ulong)(uVar5 >> 3 & 0x1ffc) + 8);
          uVar9 = (uVar9 * 2 - (ulong)(value < iVar4)) + 2;
        } while (iVar4 != value);
      }
    }
    RepeatedField<int>::Add(this,value);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar10) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar6 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
        *puVar6 = *puVar6 | (uint)hasbits;
      }
      return (char *)puVar10;
    }
    uVar3 = *puVar10;
    ptr = (char *)puVar10;
    if (uVar3 != uVar2) {
      uVar5 = (uint)table->fast_idx_mask & (uint)uVar3;
      if ((uVar5 & 7) == 0) {
        uVar9 = (ulong)(uVar5 & 0xfffffff8);
        pcVar11 = (char *)(**(code **)(&table[1].has_bits_offset + uVar9))
                                    (msg,puVar10,ctx,
                                     (ulong)uVar3 ^ *(ulong *)(&table[1].fast_idx_mask + uVar9 * 2),
                                     table,hasbits);
        return pcVar11;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x452);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEvR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedEnum<uint16_t, field_layout::kTvEnum>(
      PROTOBUF_TC_PARAM_PASS);
}